

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_mul_mpi(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  undefined1 local_68 [8];
  mbedtls_mpi TB;
  mbedtls_mpi TA;
  size_t j;
  size_t i;
  mbedtls_mpi *pmStack_20;
  int ret;
  mbedtls_mpi *B_local;
  mbedtls_mpi *A_local;
  mbedtls_mpi *X_local;
  
  mbedtls_mpi_init((mbedtls_mpi *)&TB.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_68);
  B_local = A;
  if (X == A) {
    i._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&TB.p,A);
    if (i._4_4_ != 0) goto LAB_0010c932;
    B_local = (mbedtls_mpi *)&TB.p;
  }
  pmStack_20 = B;
  if (X == B) {
    i._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)local_68,B);
    if (i._4_4_ != 0) goto LAB_0010c932;
    pmStack_20 = (mbedtls_mpi *)local_68;
  }
  for (j = B_local->n; (j != 0 && (B_local->p[j - 1] == 0)); j = j - 1) {
  }
  for (TA.p = (mbedtls_mpi_uint *)pmStack_20->n;
      (TA.p != (mbedtls_mpi_uint *)0x0 && (pmStack_20->p[(long)TA.p + -1] == 0));
      TA.p = (mbedtls_mpi_uint *)((long)TA.p + -1)) {
  }
  i._4_4_ = mbedtls_mpi_grow(X,j + (long)TA.p);
  if ((i._4_4_ == 0) && (i._4_4_ = mbedtls_mpi_lset(X,0), i._4_4_ == 0)) {
    for (; TA.p != (mbedtls_mpi_uint *)0x0; TA.p = (mbedtls_mpi_uint *)((long)TA.p + -1)) {
      mpi_mul_hlp(j,B_local->p,X->p + (long)TA.p + -1,pmStack_20->p[(long)TA.p + -1]);
    }
    X->s = B_local->s * pmStack_20->s;
  }
LAB_0010c932:
  mbedtls_mpi_free((mbedtls_mpi *)local_68);
  mbedtls_mpi_free((mbedtls_mpi *)&TB.p);
  return i._4_4_;
}

Assistant:

int mbedtls_mpi_mul_mpi( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j;
    mbedtls_mpi TA, TB;
    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( A != NULL );
    MPI_VALIDATE_RET( B != NULL );

    mbedtls_mpi_init( &TA ); mbedtls_mpi_init( &TB );

    if( X == A ) { MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TA, A ) ); A = &TA; }
    if( X == B ) { MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TB, B ) ); B = &TB; }

    for( i = A->n; i > 0; i-- )
        if( A->p[i - 1] != 0 )
            break;

    for( j = B->n; j > 0; j-- )
        if( B->p[j - 1] != 0 )
            break;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, i + j ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

    for( ; j > 0; j-- )
        mpi_mul_hlp( i, A->p, X->p + j - 1, B->p[j - 1] );

    X->s = A->s * B->s;

cleanup:

    mbedtls_mpi_free( &TB ); mbedtls_mpi_free( &TA );

    return( ret );
}